

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O3

int __thiscall ncnn::Crop::forward(Crop *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  Mat *pMVar9;
  int iVar10;
  void *pvVar11;
  Allocator *pAVar12;
  int *piVar13;
  size_t sVar14;
  ulong uVar15;
  int h;
  void *pvVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  int h_1;
  bool bVar20;
  int _woffset;
  int _hoffset;
  int _outc;
  int _outd;
  int _outh;
  int _coffset;
  Mat *local_150;
  Option *local_148;
  int _outw;
  int _doffset;
  size_t local_138;
  ulong local_130;
  Mat local_128;
  Mat m;
  Mat m_1;
  
  iVar10 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  iVar2 = bottom_blob->c;
  local_138 = bottom_blob->elemsize;
  _outw = -1;
  _outh = -1;
  _outd = -1;
  if (3 < bottom_blob->dims - 1U) {
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    resolve_crop_roi(this,&local_128,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                     &_outc);
    return 0;
  }
  lVar18 = (long)iVar10;
  lVar19 = (long)iVar8;
  local_150 = top_blob;
  local_128.w = iVar10;
  local_128.h = iVar8;
  switch(bottom_blob->dims) {
  case 1:
    local_128.cstep = bottom_blob->elempack * lVar18;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 4;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 1;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 1;
    local_128.w = (int)local_128.cstep;
    local_128.h = 1;
    local_128.d = 1;
    local_128.c = 1;
    resolve_crop_roi(this,&local_128,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                     &_outc);
    pMVar9 = local_150;
    if (_outw != iVar10) {
      Mat::create(local_150,_outw,local_138,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_138 == 4) {
        _hoffset = 0;
LAB_001c404d:
        copy_cut_border_image<float>(bottom_blob,pMVar9,_hoffset,_woffset);
        return 0;
      }
      if (local_138 == 2) {
        _hoffset = 0;
LAB_001c4027:
        copy_cut_border_image<unsigned_short>(bottom_blob,pMVar9,_hoffset,_woffset);
        return 0;
      }
      if (local_138 != 1) {
        return 0;
      }
      _hoffset = 0;
LAB_001c38e1:
      copy_cut_border_image<signed_char>(bottom_blob,pMVar9,_hoffset,_woffset);
      return 0;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_150->refcount;
    if (piVar13 == (int *)0x0) goto LAB_001c4061;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_001c4061;
    pvVar16 = local_150->data;
    pAVar12 = local_150->allocator;
    if (pAVar12 != (Allocator *)0x0) goto LAB_001c371b;
    goto joined_r0x001c3631;
  case 2:
    lVar19 = bottom_blob->elempack * lVar19;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 4;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 1;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 2;
    local_128.h = (int)lVar19;
    local_128.d = 1;
    local_128.c = 1;
    local_128.cstep = lVar19 * lVar18;
    resolve_crop_roi(this,&local_128,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                     &_outc);
    pMVar9 = local_150;
    if (iVar8 != _outh || _outw != iVar10) {
      Mat::create(local_150,_outw,_outh,local_138,opt->blob_allocator);
      if (pMVar9->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar9->c * pMVar9->cstep == 0) {
        return -100;
      }
      if (local_138 == 4) goto LAB_001c404d;
      if (local_138 == 2) goto LAB_001c4027;
      if (local_138 != 1) {
        return 0;
      }
      goto LAB_001c38e1;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_150->refcount;
    if (piVar13 == (int *)0x0) goto LAB_001c4061;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_001c4061;
    pvVar16 = local_150->data;
    pAVar12 = local_150->allocator;
    break;
  case 3:
    local_128.c = bottom_blob->elempack * iVar2;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 4;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 1;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 3;
    local_128.d = 1;
    local_128.cstep = lVar19 * lVar18 + 3U & 0x3ffffffffffffffc;
    local_148 = opt;
    resolve_crop_roi(this,&local_128,&_woffset,&_hoffset,&_doffset,&_coffset,&_outw,&_outh,&_outd,
                     &_outc);
    pMVar9 = local_150;
    if ((_outh != iVar8 || _outw != iVar10) || _outc != iVar2) {
      local_128.w = bottom_blob->w;
      local_128.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        sVar14 = bottom_blob->elemsize;
        local_128.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar14 + (long)bottom_blob->data);
        lVar19 = (long)local_128.h * (long)local_128.w * sVar14;
        local_128.d = 1;
        local_128.dims = 3;
      }
      else {
        local_128.d = bottom_blob->d;
        sVar14 = bottom_blob->elemsize;
        local_128.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar14 + (long)bottom_blob->data);
        lVar19 = (long)local_128.h * (long)local_128.w * (long)local_128.d * sVar14;
        local_128.dims = 4;
      }
      local_128.allocator = bottom_blob->allocator;
      local_128.elempack = bottom_blob->elempack;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = (undefined4)sVar14;
      local_128.elemsize._4_4_ = (undefined4)(sVar14 >> 0x20);
      local_128.cstep = (lVar19 + 0xfU & 0xfffffffffffffff0) / sVar14;
      local_128.c = _outc;
      if (_outh != iVar8 || _outw != iVar10) {
        Mat::create(local_150,_outw,_outh,_outc,local_138,local_148->blob_allocator);
        iVar10 = -100;
        if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
          if (0 < _outc) {
            local_130 = (ulong)(uint)_outc;
            uVar15 = 0;
            do {
              m.c = 1;
              if (local_128.dims != 3) {
                m.c = local_128.d;
              }
              local_148 = (Option *)(long)local_128.w;
              m.dims = local_128.dims == 3 ^ 3;
              m.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
              m.data = (void *)(local_128.cstep * uVar15 * m.elemsize + (long)local_128.data);
              m.refcount = (int *)0x0;
              m.elempack = local_128.elempack;
              m.allocator = local_128.allocator;
              m.w = local_128.w;
              m.h = local_128.h;
              m.cstep = (long)local_128.h * (long)local_148;
              m.d = 1;
              bVar20 = pMVar9->dims == 3;
              m_1.c = 1;
              if (!bVar20) {
                m_1.c = pMVar9->d;
              }
              uVar3 = pMVar9->w;
              iVar10 = pMVar9->h;
              m_1.dims = bVar20 ^ 3;
              m_1.elemsize = pMVar9->elemsize;
              pvVar16 = (void *)(pMVar9->cstep * uVar15 * m_1.elemsize + (long)pMVar9->data);
              m_1.elempack = pMVar9->elempack;
              m_1.allocator = pMVar9->allocator;
              m_1.refcount = (int *)0x0;
              m_1.cstep = (long)iVar10 * (long)(int)uVar3;
              m_1.d = 1;
              m_1.data = pvVar16;
              m_1.w = uVar3;
              m_1.h = iVar10;
              if (local_138 == 4) {
                copy_cut_border_image<float>(&m,&m_1,_hoffset,_woffset);
              }
              else if (local_138 == 2) {
                copy_cut_border_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
              }
              else if ((local_138 == 1) && (0 < iVar10)) {
                pvVar11 = (void *)((long)m.data +
                                  m.elemsize * (long)local_148 * (long)_hoffset + (long)_woffset);
                iVar8 = 0;
                do {
                  if ((int)uVar3 < 0xc) {
                    if (0 < (int)uVar3) {
                      uVar17 = 0;
                      do {
                        *(undefined1 *)((long)pvVar16 + uVar17) =
                             *(undefined1 *)((long)pvVar11 + uVar17);
                        uVar17 = uVar17 + 1;
                      } while (uVar3 != uVar17);
                    }
                  }
                  else {
                    memcpy(pvVar16,pvVar11,(ulong)uVar3);
                  }
                  pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar3);
                  pvVar11 = (void *)((long)pvVar11 + (long)local_148);
                  iVar8 = iVar8 + 1;
                } while (iVar8 != iVar10);
              }
              uVar15 = uVar15 + 1;
              pMVar9 = local_150;
            } while (uVar15 < local_130);
          }
          goto LAB_001c4178;
        }
      }
      else {
        Mat::clone(&m,(__fn *)&local_128,(void *)0x0,_outh,(void *)(ulong)(uint)local_128.h);
        pMVar9 = local_150;
        if (&m != local_150) {
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + 1;
            UNLOCK();
          }
          piVar13 = local_150->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar9->data = m.data;
          pMVar9->refcount = m.refcount;
          pMVar9->elemsize = m.elemsize;
          pMVar9->elempack = m.elempack;
          pMVar9->allocator = m.allocator;
          pMVar9->dims = m.dims;
          pMVar9->w = m.w;
          pMVar9->h = m.h;
          pMVar9->d = m.d;
          pMVar9->c = m.c;
          pMVar9->cstep = m.cstep;
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar9->data == (void *)0x0) || ((long)pMVar9->c * pMVar9->cstep == 0)) {
          iVar10 = -100;
        }
        else {
LAB_001c4178:
          iVar10 = 0;
        }
      }
      piVar13 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar13 == (int *)0x0) {
        return iVar10;
      }
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 != 0) {
        return iVar10;
      }
      if (local_128.allocator != (Allocator *)0x0) {
        (*(local_128.allocator)->_vptr_Allocator[3])();
        return iVar10;
      }
joined_r0x001c42ad:
      if (local_128.data == (void *)0x0) {
        return iVar10;
      }
      local_128.allocator = (Allocator *)0x0;
      free(local_128.data);
      return iVar10;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_150->refcount;
    if (piVar13 == (int *)0x0) goto LAB_001c4061;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_001c4061;
    pvVar16 = local_150->data;
    pAVar12 = local_150->allocator;
    break;
  case 4:
    local_128.c = bottom_blob->elempack * iVar2;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 4;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 1;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 4;
    local_128.cstep = lVar19 * lVar18 * (long)iVar1 + 3U & 0x3ffffffffffffffc;
    piVar13 = &_doffset;
    local_148 = opt;
    local_128.d = iVar1;
    resolve_crop_roi(this,&local_128,&_woffset,&_hoffset,piVar13,&_coffset,&_outw,&_outh,&_outd,
                     &_outc);
    pMVar9 = local_150;
    iVar6 = _outd;
    bVar20 = _outd == iVar1;
    bVar4 = _outh == iVar8;
    bVar5 = _outw == iVar10;
    if ((!bVar20 || (!bVar4 || !bVar5)) || _outc != iVar2) {
      local_128.w = bottom_blob->w;
      local_128.h = bottom_blob->h;
      if (bottom_blob->dims == 3) {
        sVar14 = bottom_blob->elemsize;
        local_128.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar14 + (long)bottom_blob->data);
        lVar19 = (long)local_128.h * (long)local_128.w * sVar14;
        local_128.d = 1;
        local_128.dims = 3;
      }
      else {
        local_128.d = bottom_blob->d;
        sVar14 = bottom_blob->elemsize;
        local_128.data =
             (void *)((long)_coffset * bottom_blob->cstep * sVar14 + (long)bottom_blob->data);
        lVar19 = (long)local_128.h * (long)local_128.w * (long)local_128.d * sVar14;
        local_128.dims = 4;
      }
      local_128.allocator = bottom_blob->allocator;
      local_128.elempack = bottom_blob->elempack;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = (undefined4)sVar14;
      local_128.elemsize._4_4_ = (undefined4)(sVar14 >> 0x20);
      local_128.cstep = (lVar19 + 0xfU & 0xfffffffffffffff0) / sVar14;
      local_128.c = _outc;
      if (bVar20 && (bVar4 && bVar5)) {
        Mat::clone(&m,(__fn *)&local_128,(void *)0x0,(int)local_148,
                   (void *)CONCAT71((int7)((ulong)piVar13 >> 8),bVar20 && (bVar4 && bVar5)));
        pMVar9 = local_150;
        if (&m != local_150) {
          if (m.refcount != (int *)0x0) {
            LOCK();
            *m.refcount = *m.refcount + 1;
            UNLOCK();
          }
          piVar13 = local_150->refcount;
          if (piVar13 != (int *)0x0) {
            LOCK();
            *piVar13 = *piVar13 + -1;
            UNLOCK();
            if (*piVar13 == 0) {
              if (local_150->allocator == (Allocator *)0x0) {
                if (local_150->data != (void *)0x0) {
                  free(local_150->data);
                }
              }
              else {
                (*local_150->allocator->_vptr_Allocator[3])();
              }
            }
          }
          pMVar9->data = m.data;
          pMVar9->refcount = m.refcount;
          pMVar9->elemsize = m.elemsize;
          pMVar9->elempack = m.elempack;
          pMVar9->allocator = m.allocator;
          pMVar9->dims = m.dims;
          pMVar9->w = m.w;
          pMVar9->h = m.h;
          pMVar9->d = m.d;
          pMVar9->c = m.c;
          pMVar9->cstep = m.cstep;
        }
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              if (m.data != (void *)0x0) {
                free(m.data);
              }
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        if ((pMVar9->data == (void *)0x0) || ((long)pMVar9->c * pMVar9->cstep == 0)) {
          iVar10 = -100;
        }
        else {
LAB_001c4270:
          iVar10 = 0;
        }
      }
      else {
        uVar15 = (ulong)(uint)_outd;
        Mat::create(local_150,_outw,_outh,_outd,_outc,local_138,local_148->blob_allocator);
        iVar10 = -100;
        if ((pMVar9->data != (void *)0x0) && ((long)pMVar9->c * pMVar9->cstep != 0)) {
          if (0 < _outc) {
            local_130 = 0;
            do {
              if (0 < iVar6) {
                uVar17 = 0;
                do {
                  local_148 = (Option *)(long)local_128.w;
                  m.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
                  m.cstep = (long)local_128.h * (long)local_148;
                  m.data = (void *)((long)local_128.data +
                                   ((long)(int)uVar17 + (long)_doffset) * m.elemsize * m.cstep +
                                   local_128.cstep * local_130 * m.elemsize);
                  m.refcount = (int *)0x0;
                  m.elempack = local_128.elempack;
                  m.allocator = local_128.allocator;
                  m.dims = 2;
                  m.w = local_128.w;
                  m.h = local_128.h;
                  m.d = 1;
                  m.c = 1;
                  uVar3 = pMVar9->w;
                  m_1.elemsize = pMVar9->elemsize;
                  iVar10 = pMVar9->h;
                  m_1.elempack = pMVar9->elempack;
                  m_1.cstep = (long)iVar10 * (long)(int)uVar3;
                  pvVar16 = (void *)((long)pMVar9->data +
                                    uVar17 * m_1.elemsize * m_1.cstep +
                                    pMVar9->cstep * local_130 * m_1.elemsize);
                  m_1.allocator = pMVar9->allocator;
                  m_1.refcount = (int *)0x0;
                  m_1.dims = 2;
                  m_1.d = 1;
                  m_1.c = 1;
                  m_1.data = pvVar16;
                  m_1.w = uVar3;
                  m_1.h = iVar10;
                  if (local_138 == 4) {
                    copy_cut_border_image<float>(&m,&m_1,_hoffset,_woffset);
                  }
                  else if (local_138 == 2) {
                    copy_cut_border_image<unsigned_short>(&m,&m_1,_hoffset,_woffset);
                  }
                  else if ((local_138 == 1) && (0 < iVar10)) {
                    pvVar11 = (void *)((long)m.data +
                                      (long)_hoffset * (long)local_148 * m.elemsize + (long)_woffset
                                      );
                    iVar8 = 0;
                    do {
                      if ((int)uVar3 < 0xc) {
                        if (0 < (int)uVar3) {
                          uVar7 = 0;
                          do {
                            *(undefined1 *)((long)pvVar16 + uVar7) =
                                 *(undefined1 *)((long)pvVar11 + uVar7);
                            uVar7 = uVar7 + 1;
                          } while (uVar3 != uVar7);
                        }
                      }
                      else {
                        memcpy(pvVar16,pvVar11,(ulong)uVar3);
                      }
                      pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar3);
                      pvVar11 = (void *)((long)pvVar11 + (long)local_148);
                      iVar8 = iVar8 + 1;
                    } while (iVar8 != iVar10);
                  }
                  uVar17 = uVar17 + 1;
                  pMVar9 = local_150;
                } while (uVar17 < uVar15);
              }
              local_130 = local_130 + 1;
            } while (local_130 < (uint)_outc);
          }
          goto LAB_001c4270;
        }
      }
      piVar13 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar13 == (int *)0x0) {
        return iVar10;
      }
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 != 0) {
        return iVar10;
      }
      if (local_128.allocator != (Allocator *)0x0) {
        (*(local_128.allocator)->_vptr_Allocator[3])();
        return iVar10;
      }
      goto joined_r0x001c42ad;
    }
    if (local_150 == bottom_blob) {
      return 0;
    }
    piVar13 = bottom_blob->refcount;
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + 1;
      UNLOCK();
    }
    piVar13 = local_150->refcount;
    if (piVar13 == (int *)0x0) goto LAB_001c4061;
    LOCK();
    *piVar13 = *piVar13 + -1;
    UNLOCK();
    if (*piVar13 != 0) goto LAB_001c4061;
    pvVar16 = local_150->data;
    pAVar12 = local_150->allocator;
  }
  pMVar9 = local_150;
  if (pAVar12 == (Allocator *)0x0) {
joined_r0x001c3631:
    local_150 = pMVar9;
    if (pvVar16 != (void *)0x0) {
      free(pvVar16);
      local_150 = pMVar9;
    }
  }
  else {
LAB_001c371b:
    pMVar9 = local_150;
    (*pAVar12->_vptr_Allocator[3])();
    local_150 = pMVar9;
  }
LAB_001c4061:
  local_150->cstep = 0;
  local_150->data = (void *)0x0;
  local_150->refcount = (int *)0x0;
  *(undefined8 *)((long)&local_150->refcount + 4) = 0;
  *(undefined8 *)((long)&local_150->elemsize + 4) = 0;
  local_150->dims = 0;
  local_150->w = 0;
  local_150->h = 0;
  local_150->d = 0;
  local_150->c = 0;
  piVar13 = bottom_blob->refcount;
  local_150->data = bottom_blob->data;
  local_150->refcount = piVar13;
  local_150->elemsize = bottom_blob->elemsize;
  local_150->elempack = bottom_blob->elempack;
  local_150->allocator = bottom_blob->allocator;
  iVar10 = bottom_blob->w;
  iVar8 = bottom_blob->h;
  iVar1 = bottom_blob->d;
  local_150->dims = bottom_blob->dims;
  local_150->w = iVar10;
  local_150->h = iVar8;
  local_150->d = iVar1;
  local_150->c = bottom_blob->c;
  local_150->cstep = bottom_blob->cstep;
  return 0;
}

Assistant:

int Crop::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    int _woffset, _hoffset, _doffset, _coffset;
    int _outw = -1, _outh = -1, _outd = -1, _outc;
    resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    if (dims == 4)
    {
        if (_outw == w && _outh == h && _outd == d && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h && _outd == d)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outd, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < _outc; q++)
        {
            for (int z = 0; z < _outd; z++)
            {
                const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                Mat borderm = top_blob.channel(q).depth(z);

                if (elemsize == 1)
                    copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
                if (elemsize == 2)
                    copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
                if (elemsize == 4)
                    copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
            }
        }

        return 0;
    }

    return 0;
}